

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derivatives.cpp
# Opt level: O0

void lts2::DivergenceWithBackwardScheme(Mat *X1,Mat *X2,Mat *divX)

{
  _InputArray *p_Var1;
  Mat local_290 [352];
  Mat local_130 [8];
  Mat DX2;
  Mat local_d0 [8];
  Mat DX1;
  Scalar_<double> local_60;
  _InputArray local_40;
  MatSize local_28 [8];
  _InputArray *local_20;
  Mat *divX_local;
  Mat *X2_local;
  Mat *X1_local;
  
  if ((*(long *)(X1 + 0x10) != 0) && (*(long *)(X2 + 0x10) != 0)) {
    local_20 = (_InputArray *)divX;
    divX_local = X2;
    X2_local = X1;
    cv::MatSize::operator()(local_28);
    cv::Mat::create(divX,local_28,5);
    p_Var1 = local_20;
    cv::Scalar_<double>::all(&local_60,0.0);
    cv::_InputArray::_InputArray<double,4,1>(&local_40,(Matx<double,_4,_1> *)&local_60);
    cv::noArray();
    cv::Mat::setTo(p_Var1,&local_40);
    cv::_InputArray::~_InputArray(&local_40);
    cv::Mat::Mat(local_d0);
    HorizontalGradientWithBackwardScheme(X2_local,local_d0);
    cv::Mat::Mat(local_130);
    VerticalGradientWithBackwardScheme(divX_local,local_130);
    cv::operator+(local_290,local_d0);
    cv::Mat::operator=((Mat *)local_20,(MatExpr *)local_290);
    cv::MatExpr::~MatExpr((MatExpr *)local_290);
    cv::Mat::~Mat(local_130);
    cv::Mat::~Mat(local_d0);
  }
  return;
}

Assistant:

void lts2::DivergenceWithBackwardScheme(const Mat& X1, const Mat& X2, Mat& divX)
{	
    if (!X1.data || !X2.data)
        return;
    
	divX.create(X1.size(), CV_32F);
	divX.setTo(cv::Scalar::all(0));
    
	cv::Mat DX1;
    lts2::HorizontalGradientWithBackwardScheme(X1, DX1);
	
	cv::Mat DX2;
    lts2::VerticalGradientWithBackwardScheme(X2, DX2);
	
	divX = DX1 + DX2;
}